

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::get_legal_program_name
          (string *__return_storage_ptr__,t_cpp_generator *this,string *program_name)

{
  ulong uVar1;
  string *psVar2;
  size_t found;
  string *program_name_local;
  t_cpp_generator *this_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((char)program_name,0x2e);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::replace((ulong)program_name,uVar1,(char *)0x1);
    std::__cxx11::string::operator=((string *)program_name,psVar2);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)program_name);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::get_legal_program_name(std::string program_name)
{
  std::size_t found = 0;

  while(true) {
    found = program_name.find('.');

    if(found != string::npos) {
      program_name = program_name.replace(found, 1, "_");
    } else {
      break;
    }
  }

  return program_name;
}